

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t lazy_stat(archive_write_disk *a)

{
  int iVar1;
  int *piVar2;
  archive_write_disk *a_local;
  
  if (a->pst == (stat *)0x0) {
    if ((L'\xffffffff' < a->fd) && (iVar1 = fstat(a->fd,(stat *)&a->st), iVar1 == 0)) {
      a->pst = &a->st;
      return L'\0';
    }
    iVar1 = lstat(a->name,(stat *)&a->st);
    if (iVar1 == 0) {
      a->pst = &a->st;
      a_local._4_4_ = L'\0';
    }
    else {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"Couldn\'t stat file");
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
lazy_stat(struct archive_write_disk *a)
{
	if (a->pst != NULL) {
		/* Already have stat() data available. */
		return (ARCHIVE_OK);
	}
#ifdef HAVE_FSTAT
	if (a->fd >= 0 && fstat(a->fd, &a->st) == 0) {
		a->pst = &a->st;
		return (ARCHIVE_OK);
	}
#endif
	/*
	 * XXX At this point, symlinks should not be hit, otherwise
	 * XXX a race occurred.  Do we want to check explicitly for that?
	 */
#ifdef HAVE_LSTAT
	if (lstat(a->name, &a->st) == 0)
#else
	if (la_stat(a->name, &a->st) == 0)
#endif
	{
		a->pst = &a->st;
		return (ARCHIVE_OK);
	}
	archive_set_error(&a->archive, errno, "Couldn't stat file");
	return (ARCHIVE_WARN);
}